

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_> __thiscall
fmt::v7::detail::write_bytes<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (detail *this,back_insert_iterator<fmt::v7::detail::buffer<char>_> out,string_view bytes,
          basic_format_specs<char> *specs)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  uint *puVar2;
  char *pcVar3;
  char *data;
  ulong n;
  ulong uVar4;
  
  puVar2 = (uint *)bytes.size_;
  pcVar3 = bytes.data_;
  uVar4 = 0;
  if (pcVar3 <= (char *)(ulong)*puVar2) {
    uVar4 = (long)(ulong)*puVar2 - (long)pcVar3;
  }
  n = uVar4 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                         (ulong)(*(byte *)((long)puVar2 + 9) & 0xf)) & 0x3f);
  bVar1 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)this,n,
                     (fill_t<char> *)((long)puVar2 + 10));
  bVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                    (out.container,pcVar3 + (long)out.container,bVar1);
  bVar1 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (bVar1,uVar4 - n,(fill_t<char> *)((long)puVar2 + 10));
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}